

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O0

void __thiscall
pbrt::CPUAggregate::CPUAggregate
          (CPUAggregate *this,BasicScene *scene,NamedTextures *textures,
          map<int,_pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>_*>_>_>
          *shapeIndexToAreaLights,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium>_>_>
          *media,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Material>_>_>
                 *namedMaterials,vector<pbrt::Material,_std::allocator<pbrt::Material>_> *materials)

{
  WavefrontAggregate *in_RDI;
  Primitive *in_stack_00000008;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Material>_>_>
  *in_stack_00000258;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium>_>_>
  *in_stack_00000260;
  map<int,_pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>_*>_>_>
  *in_stack_00000268;
  NamedTextures *in_stack_00000270;
  BasicScene *in_stack_00000278;
  vector<pbrt::Material,_std::allocator<pbrt::Material>_> *in_stack_00000290;
  
  WavefrontAggregate::WavefrontAggregate(in_RDI);
  in_RDI->_vptr_WavefrontAggregate = (_func_int **)&PTR__CPUAggregate_03801940;
  Primitive::Primitive((Primitive *)0xa0671e);
  BasicScene::CreateAggregate
            (in_stack_00000278,in_stack_00000270,in_stack_00000268,in_stack_00000260,
             in_stack_00000258,in_stack_00000290);
  Primitive::operator=((Primitive *)in_RDI,in_stack_00000008);
  return;
}

Assistant:

CPUAggregate::CPUAggregate(
    BasicScene &scene, NamedTextures &textures,
    const std::map<int, pstd::vector<Light> *> &shapeIndexToAreaLights,
    const std::map<std::string, Medium> &media,
    const std::map<std::string, pbrt::Material> &namedMaterials,
    const std::vector<pbrt::Material> &materials) {
    aggregate = scene.CreateAggregate(textures, shapeIndexToAreaLights, media,
                                      namedMaterials, materials);
}